

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::ListUniqueBind
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  LogicalType *in_RCX;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> in_RDI;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_stack_00000528;
  ScalarFunction *in_stack_00000530;
  ClientContext *in_stack_00000538;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> this;
  LogicalTypeId in_stack_ffffffffffffffdf;
  
  this._M_head_impl = in_RDI._M_head_impl;
  LogicalType::LogicalType(in_RCX,in_stack_ffffffffffffffdf);
  LogicalType::operator=((LogicalType *)this._M_head_impl,(LogicalType *)in_RDI._M_head_impl);
  LogicalType::~LogicalType((LogicalType *)0x2023e63);
  ListAggregatesBind<false>(in_stack_00000538,in_stack_00000530,in_stack_00000528);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         this._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> ListUniqueBind(ClientContext &context, ScalarFunction &bound_function,
                                               vector<unique_ptr<Expression>> &arguments) {

	D_ASSERT(bound_function.arguments.size() == 1);
	D_ASSERT(arguments.size() == 1);
	bound_function.return_type = LogicalType::UBIGINT;

	return ListAggregatesBind<>(context, bound_function, arguments);
}